

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O2

void Abc_ObjSortInReverseOrder(Abc_Ntk_t *pNtk,Vec_Ptr_t *vNodes)

{
  Vec_Ptr_t *p;
  void *pvVar1;
  int iVar2;
  
  p = Abc_NtkDfsReverse(pNtk);
  for (iVar2 = 0; iVar2 < p->nSize; iVar2 = iVar2 + 1) {
    pvVar1 = Vec_PtrEntry(p,iVar2);
    *(int *)((long)pvVar1 + 0x40) = iVar2;
  }
  if (1 < (long)vNodes->nSize) {
    qsort(vNodes->pArray,(long)vNodes->nSize,8,Abc_ObjCompareByNumber);
  }
  for (iVar2 = 0; iVar2 < p->nSize; iVar2 = iVar2 + 1) {
    pvVar1 = Vec_PtrEntry(p,iVar2);
    *(undefined4 *)((long)pvVar1 + 0x40) = 0;
  }
  Vec_PtrFree(p);
  return;
}

Assistant:

void Abc_ObjSortInReverseOrder( Abc_Ntk_t * pNtk, Vec_Ptr_t * vNodes )
{
    Vec_Ptr_t * vOrder;
    Abc_Obj_t * pNode; 
    int i;
    vOrder = Abc_NtkDfsReverse( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pNode, i )
        pNode->iTemp = i;
    Vec_PtrSort( vNodes, (int (*)())Abc_ObjCompareByNumber );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pNode, i )
        pNode->iTemp = 0;
    Vec_PtrFree( vOrder );
}